

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O2

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  char *pcVar1;
  undefined8 uStackY_30;
  
  if (nread < 1) {
    pcVar1 = "nread > 0";
    uStackY_30 = 0x3f;
  }
  else if (nread == 4) {
    if (addr == (sockaddr *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
              ,0x47,"addr","!=","NULL",0,"!=",0);
      abort();
    }
    if (*(int *)rcvbuf->base == 0x54495845) {
      uv_close((uv_handle_t *)handle,close_cb);
      uv_close((uv_handle_t *)&client,close_cb);
      sv_recv_cb_called = sv_recv_cb_called + 1;
      return;
    }
    pcVar1 = "memcmp(\"EXIT\", rcvbuf->base, nread) == 0";
    uStackY_30 = 0x49;
  }
  else {
    pcVar1 = "nread == 4";
    uStackY_30 = 0x46;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
          ,uStackY_30,pcVar1);
  abort();
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  if (nread > 0) {
    ASSERT(nread == 4);
    ASSERT_NOT_NULL(addr);
    ASSERT(memcmp("EXIT", rcvbuf->base, nread) == 0);
    if (++sv_recv_cb_called == 4) {
      uv_close((uv_handle_t*) &server, close_cb);
      uv_close((uv_handle_t*) &client, close_cb);
    }
  }
}